

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::AddCuePoint(Segment *this,uint64_t timestamp,uint64_t track)

{
  Cluster *pCVar1;
  bool bVar2;
  CuePoint *this_00;
  
  if (((0 < (long)this->cluster_list_size_) &&
      (pCVar1 = this->cluster_list_[(long)this->cluster_list_size_ + -1], pCVar1 != (Cluster *)0x0))
     && (this_00 = (CuePoint *)operator_new(0x28,(nothrow_t *)&std::nothrow),
        this_00 != (CuePoint *)0x0)) {
    CuePoint::CuePoint(this_00);
    this_00->time_ = timestamp / (this->segment_info_).timecode_scale_;
    this_00->block_number_ = (long)pCVar1->blocks_added_;
    this_00->cluster_pos_ = pCVar1->position_for_cues_;
    this_00->track_ = track;
    bVar2 = Cues::AddCue(&this->cues_,this_00);
    if (bVar2) {
      this->new_cuepoint_ = false;
      return true;
    }
    CuePoint::~CuePoint(this_00);
    operator_delete(this_00);
  }
  return false;
}

Assistant:

bool Segment::AddCuePoint(uint64_t timestamp, uint64_t track) {
  if (cluster_list_size_ < 1)
    return false;

  const Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
  if (!cluster)
    return false;

  CuePoint* const cue = new (std::nothrow) CuePoint();  // NOLINT
  if (!cue)
    return false;

  cue->set_time(timestamp / segment_info_.timecode_scale());
  cue->set_block_number(cluster->blocks_added());
  cue->set_cluster_pos(cluster->position_for_cues());
  cue->set_track(track);
  if (!cues_.AddCue(cue)) {
    delete cue;
    return false;
  }

  new_cuepoint_ = false;
  return true;
}